

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3BinaryCompareCollSeq(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  CollSeq *local_28;
  CollSeq *pColl;
  Expr *pRight_local;
  Expr *pLeft_local;
  Parse *pParse_local;
  
  if ((pLeft->flags & 0x100) == 0) {
    if ((pRight == (Expr *)0x0) || ((pRight->flags & 0x100) == 0)) {
      local_28 = sqlite3ExprCollSeq(pParse,pLeft);
      if (local_28 == (CollSeq *)0x0) {
        local_28 = sqlite3ExprCollSeq(pParse,pRight);
      }
    }
    else {
      local_28 = sqlite3ExprCollSeq(pParse,pRight);
    }
  }
  else {
    local_28 = sqlite3ExprCollSeq(pParse,pLeft);
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3BinaryCompareCollSeq(
  Parse *pParse, 
  Expr *pLeft, 
  Expr *pRight
){
  CollSeq *pColl;
  assert( pLeft );
  if( pLeft->flags & EP_Collate ){
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
  }else if( pRight && (pRight->flags & EP_Collate)!=0 ){
    pColl = sqlite3ExprCollSeq(pParse, pRight);
  }else{
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
    if( !pColl ){
      pColl = sqlite3ExprCollSeq(pParse, pRight);
    }
  }
  return pColl;
}